

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_segment_tree.cpp
# Opt level: O2

void __thiscall
duckdb::WindowSegmentTreeState::Evaluate
          (WindowSegmentTreeState *this,WindowSegmentTreeGlobalState *gtstate,DataChunk *bounds,
          Vector *result,idx_t count,idx_t row_idx)

{
  unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
  *this_00;
  WindowExcludeMode WVar1;
  idx_t *begins;
  undefined8 tree;
  undefined8 ends;
  undefined8 row_idx_00;
  unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_> __p
  ;
  _Head_base<0UL,_duckdb::WindowSegmentTreePart_*,_false> __p_00;
  const_reference pvVar2;
  pointer pWVar3;
  type other;
  idx_t *piVar4;
  unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
  *this_01;
  undefined1 local_70 [56];
  _Head_base<0UL,_duckdb::WindowSegmentTreePart_*,_false> local_38;
  
  local_70._40_8_ = row_idx;
  pvVar2 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,6);
  begins = (idx_t *)pvVar2->data;
  pvVar2 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,7);
  local_70._32_8_ = pvVar2->data;
  pvVar2 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,2);
  local_70._48_8_ = pvVar2->data;
  pvVar2 = vector<duckdb::Vector,_true>::get<true>(&bounds->data,3);
  local_70._16_8_ = pvVar2->data;
  this_01 = &this->part;
  local_70._24_8_ = gtstate;
  if ((this->part).
      super_unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::WindowSegmentTreePart_*,_std::default_delete<duckdb::WindowSegmentTreePart>_>
      .super__Head_base<0UL,_duckdb::WindowSegmentTreePart_*,_false>._M_head_impl ==
      (WindowSegmentTreePart *)0x0) {
    unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true>::operator->
              (&(this->super_WindowAggregatorLocalState).cursor);
    WindowCursor::Copy((WindowCursor *)local_70);
    make_uniq<duckdb::WindowSegmentTreePart,duckdb::ArenaAllocator&,duckdb::AggregateObject_const&,duckdb::unique_ptr<duckdb::WindowCursor,std::default_delete<duckdb::WindowCursor>,true>,duckdb::ValidityArray_const&>
              ((duckdb *)&stack0xffffffffffffffc8,
               &(this->super_WindowAggregatorLocalState).super_WindowAggregatorState.allocator,
               &(gtstate->super_WindowAggregatorGlobalState).aggr,
               (unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>,_true> *)
               local_70,&(gtstate->super_WindowAggregatorGlobalState).filter_mask);
    __p._M_t.
    super___uniq_ptr_impl<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
    ._M_t.
    super__Tuple_impl<0UL,_duckdb::WindowSegmentTreePart_*,_std::default_delete<duckdb::WindowSegmentTreePart>_>
    .super__Head_base<0UL,_duckdb::WindowSegmentTreePart_*,_false>._M_head_impl =
         (__uniq_ptr_data<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true,_true>
          )(__uniq_ptr_data<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true,_true>
            )local_38._M_head_impl;
    local_38._M_head_impl = (WindowSegmentTreePart *)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
    ::reset((__uniq_ptr_impl<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
             *)this_01,
            (pointer)__p._M_t.
                     super___uniq_ptr_impl<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_duckdb::WindowSegmentTreePart_*,_std::default_delete<duckdb::WindowSegmentTreePart>_>
                     .super__Head_base<0UL,_duckdb::WindowSegmentTreePart_*,_false>._M_head_impl);
    ::std::
    unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>::
    ~unique_ptr((unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
                 *)&stack0xffffffffffffffc8);
    ::std::unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_>::~unique_ptr
              ((unique_ptr<duckdb::WindowCursor,_std::default_delete<duckdb::WindowCursor>_> *)
               local_70);
  }
  tree = local_70._24_8_;
  WVar1 = (*(WindowAggregator **)(local_70._24_8_ + 0x58))->exclude_mode;
  if (WVar1 == NO_OTHER) {
    pWVar3 = unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
             ::operator->(this_01);
    WindowSegmentTreePart::Evaluate
              (pWVar3,(WindowSegmentTreeGlobalState *)tree,begins,(idx_t *)local_70._32_8_,
               (idx_t *)0x0,(Vector *)row_idx,count,local_70._40_8_,FULL);
  }
  else {
    piVar4 = (idx_t *)local_70._48_8_;
    if (WVar1 == CURRENT_ROW) {
      piVar4 = (idx_t *)local_70._16_8_;
    }
    pWVar3 = unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
             ::operator->(this_01);
    row_idx_00 = local_70._40_8_;
    ends = local_70._32_8_;
    local_70._8_8_ = this_01;
    WindowSegmentTreePart::Evaluate
              (pWVar3,(WindowSegmentTreeGlobalState *)tree,begins,piVar4,(idx_t *)local_70._32_8_,
               (Vector *)row_idx,count,local_70._40_8_,LEFT);
    this_00 = &this->right_part;
    if ((this->right_part).
        super_unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::WindowSegmentTreePart_*,_std::default_delete<duckdb::WindowSegmentTreePart>_>
        .super__Head_base<0UL,_duckdb::WindowSegmentTreePart_*,_false>._M_head_impl ==
        (WindowSegmentTreePart *)0x0) {
      unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
      ::operator->((unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
                    *)local_70._8_8_);
      WindowSegmentTreePart::Copy((WindowSegmentTreePart *)&stack0xffffffffffffffc8);
      __p_00._M_head_impl = local_38._M_head_impl;
      local_38._M_head_impl = (pointer)0x0;
      ::std::
      __uniq_ptr_impl<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
      ::reset((__uniq_ptr_impl<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
               *)this_00,__p_00._M_head_impl);
      ::std::
      unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
      ::~unique_ptr((unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>_>
                     *)&stack0xffffffffffffffc8);
    }
    piVar4 = (idx_t *)local_70._16_8_;
    if (WVar1 == CURRENT_ROW) {
      piVar4 = (idx_t *)local_70._48_8_;
    }
    pWVar3 = unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
             ::operator->(this_00);
    WindowSegmentTreePart::Evaluate
              (pWVar3,(WindowSegmentTreeGlobalState *)local_70._24_8_,piVar4,(idx_t *)ends,begins,
               (Vector *)row_idx,count,row_idx_00,RIGHT);
    this_01 = (unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
               *)local_70._8_8_;
    pWVar3 = unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
             ::operator->((unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
                           *)local_70._8_8_);
    other = unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
            ::operator*(this_00);
    WindowSegmentTreePart::Combine(pWVar3,other,count);
  }
  pWVar3 = unique_ptr<duckdb::WindowSegmentTreePart,_std::default_delete<duckdb::WindowSegmentTreePart>,_true>
           ::operator->(this_01);
  WindowSegmentTreePart::Finalize(pWVar3,result,count);
  return;
}

Assistant:

void WindowSegmentTreeState::Evaluate(const WindowSegmentTreeGlobalState &gtstate, const DataChunk &bounds,
                                      Vector &result, idx_t count, idx_t row_idx) {
	auto window_begin = FlatVector::GetData<const idx_t>(bounds.data[FRAME_BEGIN]);
	auto window_end = FlatVector::GetData<const idx_t>(bounds.data[FRAME_END]);
	auto peer_begin = FlatVector::GetData<const idx_t>(bounds.data[PEER_BEGIN]);
	auto peer_end = FlatVector::GetData<const idx_t>(bounds.data[PEER_END]);

	if (!part) {
		part = make_uniq<WindowSegmentTreePart>(allocator, gtstate.aggr, cursor->Copy(), gtstate.filter_mask);
	}

	if (gtstate.aggregator.exclude_mode != WindowExcludeMode::NO_OTHER) {
		// If we exclude the current row, then both left and right need to contain it.
		const bool exclude_current = gtstate.aggregator.exclude_mode == WindowExcludeMode::CURRENT_ROW;

		// 1. evaluate the tree left of the excluded part
		auto middle = exclude_current ? peer_end : peer_begin;
		part->Evaluate(gtstate, window_begin, middle, window_end, result, count, row_idx, WindowSegmentTreePart::LEFT);

		// 2. set up a second state for the right of the excluded part
		if (!right_part) {
			right_part = part->Copy();
		}

		// 3. evaluate the tree right of the excluded part
		middle = exclude_current ? peer_begin : peer_end;
		right_part->Evaluate(gtstate, middle, window_end, window_begin, result, count, row_idx,
		                     WindowSegmentTreePart::RIGHT);

		// 4. combine the buffer state into the Segment Tree State
		part->Combine(*right_part, count);
	} else {
		part->Evaluate(gtstate, window_begin, window_end, nullptr, result, count, row_idx, WindowSegmentTreePart::FULL);
	}

	part->Finalize(result, count);
}